

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

Float __thiscall pbrt::DenselySampledSpectrum::operator()(DenselySampledSpectrum *this,Float lambda)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  const_reference pvVar4;
  int *in_RDI;
  uint in_XMM0_Da;
  int offset;
  
  lVar2 = std::lround((double)(ulong)in_XMM0_Da);
  iVar1 = (int)lVar2 - *in_RDI;
  if ((-1 < iVar1) &&
     (sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2)),
     (ulong)(long)iVar1 < sVar3)) {
    pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2),
                        (long)iVar1);
    return *pvVar4;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    Float operator()(Float lambda) const {
        DCHECK_GT(lambda, 0);
        int offset = std::lround(lambda) - lambda_min;
        if (offset < 0 || offset >= values.size())
            return 0;
        return values[offset];
    }